

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O2

UChar * u_strchr_63(UChar *s,UChar c)

{
  UChar c_local;
  
  if ((c & 0xf800U) == 0xd800) {
    s = u_strFindFirst_63(s,-1,&c_local,1);
  }
  else {
    for (; *s != c; s = s + 1) {
      if (*s == L'\0') {
        return (UChar *)0x0;
      }
    }
  }
  return s;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_strchr(const UChar *s, UChar c) {
    if(U16_IS_SURROGATE(c)) {
        /* make sure to not find half of a surrogate pair */
        return u_strFindFirst(s, -1, &c, 1);
    } else {
        UChar cs;

        /* trivial search for a BMP code point */
        for(;;) {
            if((cs=*s)==c) {
                return (UChar *)s;
            }
            if(cs==0) {
                return NULL;
            }
            ++s;
        }
    }
}